

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strencodings.cpp
# Opt level: O2

bool ParseUInt16(string_view str,uint16_t *out)

{
  undefined1 auVar1 [16];
  bool bVar2;
  optional<unsigned_short> oVar3;
  char *pcVar4;
  long in_FS_OFFSET;
  string_view str_00;
  string_view local_20;
  long local_10;
  
  pcVar4 = str._M_str;
  local_10 = *(long *)(in_FS_OFFSET + 0x28);
  local_20 = str;
  if (str._M_len < 2) {
    if (str._M_len == 0) {
      auVar1._8_8_ = 0;
      auVar1._0_8_ = pcVar4;
      str_00 = (string_view)(auVar1 << 0x40);
    }
    else {
      if (*pcVar4 == '+') goto LAB_001b3ae6;
      str_00._M_str = pcVar4;
      str_00._M_len = 1;
    }
  }
  else {
    str_00 = str;
    if (*pcVar4 == '+') {
      if (pcVar4[1] == '-') {
        bVar2 = false;
        goto LAB_001b3b27;
      }
LAB_001b3ae6:
      str_00 = std::basic_string_view<char,_std::char_traits<char>_>::substr
                         (&local_20,1,0xffffffffffffffff);
    }
  }
  oVar3 = ToIntegral<unsigned_short>(str_00);
  bVar2 = SUB41(((uint)oVar3.super__Optional_base<unsigned_short,_true,_true>._M_payload.
                       super__Optional_payload_base<unsigned_short> & 0x10000) >> 0x10,0);
  if ((out != (uint16_t *)0x0) &&
     (((uint)oVar3.super__Optional_base<unsigned_short,_true,_true>._M_payload.
             super__Optional_payload_base<unsigned_short> & 0x10000) != 0)) {
    *out = oVar3.super__Optional_base<unsigned_short,_true,_true>._M_payload.
           super__Optional_payload_base<unsigned_short>._M_payload;
    bVar2 = true;
  }
LAB_001b3b27:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
    return bVar2;
  }
  __stack_chk_fail();
}

Assistant:

bool ParseUInt16(std::string_view str, uint16_t* out)
{
    return ParseIntegral<uint16_t>(str, out);
}